

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput_unix.cpp
# Opt level: O2

int Lodtalk::OSIO::stWriteOffsetSizeTo(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  undefined4 extraout_var_03;
  SmallIntegerValue SVar5;
  size_t __n;
  SmallIntegerValue SVar6;
  ssize_t sVar7;
  Oop fileOop;
  Oop sizeOop;
  Oop offsetOop;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 4) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  aVar3._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
  aVar3.uintValue._4_4_ = extraout_var_01;
  offsetOop.field_0 = aVar3;
  aVar4._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,2);
  aVar4.uintValue._4_4_ = extraout_var_02;
  sizeOop.field_0 = aVar4;
  fileOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,3);
  fileOop.field_0.uintValue._4_4_ = extraout_var_03;
  if (((((uVar2 & 7) == 0) &&
       (0x4000000000 < (*(ulong *)CONCAT44(extraout_var_00,uVar2) & 0xf800000000))) &&
      ((aVar3._0_4_ & 1) != 0)) && (((aVar4._0_4_ & 1) != 0 && ((fileOop.field_0._0_4_ & 1) != 0))))
  {
    SVar5 = Oop::decodeSmallInteger(&offsetOop);
    __n = Oop::decodeSmallInteger(&sizeOop);
    SVar6 = Oop::decodeSmallInteger(&fileOop);
    if (SVar5 < 0) {
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    }
    else {
      sVar7 = write((int)SVar6,(void *)((long)CONCAT44(extraout_var_00,uVar2) + SVar5 + 8),__n);
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,sVar7);
    }
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int OSIO::stWriteOffsetSizeTo(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 4)
        return interpreter->primitiveFailed();

    Oop bufferOop = interpreter->getTemporary(0);
    Oop offsetOop = interpreter->getTemporary(1);
    Oop sizeOop = interpreter->getTemporary(2);
    Oop fileOop = interpreter->getTemporary(3);

	// Check the arguments.
	if(!bufferOop.isIndexableNativeData() || !offsetOop.isSmallInteger() || !sizeOop.isSmallInteger() || !fileOop.isSmallInteger())
		return interpreter->primitiveFailed();

	// Decode the arguments
	auto buffer = reinterpret_cast<uint8_t *> (bufferOop.getFirstFieldPointer());
	auto offset = offsetOop.decodeSmallInteger();
	auto size = sizeOop.decodeSmallInteger();
	auto file = fileOop.decodeSmallInteger();

	// Validate some of the arguments.
	if(offset < 0)
		return interpreter->primitiveFailed();

	// Perform the write
	auto res = write(file, buffer + offset, size);
	return interpreter->returnSmallInteger(res);
}